

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.h
# Opt level: O2

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
~PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this)

{
  this->_vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
       (_func_int **)&PTR__PerceptualLinearPredictiveCoefficientsAnalysis_00118630;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>);
  InverseFourierTransform::~InverseFourierTransform(&this->inverse_fourier_transform_);
  MelFilterBankAnalysis::~MelFilterBankAnalysis(&this->mel_filter_bank_analysis_);
  return;
}

Assistant:

virtual ~PerceptualLinearPredictiveCoefficientsAnalysis() {
  }